

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isPortDirection(TokenKind kind)

{
  return (bool)((byte)(0x8000004000000003 >> ((byte)(kind - InOutKeyword) & 0x3f)) &
               (ushort)(kind - InOutKeyword) < 0x40);
}

Assistant:

bool SyntaxFacts::isPortDirection(TokenKind kind) {
    switch (kind) {
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
            return true;
        default:
            return false;
    }
}